

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

KeyFrameListList * __thiscall
Assimp::FBX::FBXConverter::GetKeyframeList
          (KeyFrameListList *__return_storage_ptr__,FBXConverter *this,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *nodes,int64_t start,int64_t stop)

{
  AnimationCurve *this_00;
  bool bVar1;
  size_type sVar2;
  reference ppAVar3;
  AnimationCurveMap *this_01;
  KeyTimeList *pKVar4;
  KeyValueList *pKVar5;
  size_type sVar6;
  vector<long,_std::allocator<long>_> *this_02;
  vector<float,_std::allocator<float>_> *this_03;
  element_type *peVar7;
  element_type *peVar8;
  const_reference pvVar9;
  const_reference __x;
  tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
  local_110;
  long local_e8;
  int64_t k;
  size_t n;
  size_t count;
  shared_ptr<std::vector<float,_std::allocator<float>_>_> Values;
  shared_ptr<std::vector<long,_std::allocator<long>_>_> Keys;
  AnimationCurve *curve;
  reference ppStack_a0;
  uint mapto;
  value_type *kv;
  const_iterator __end3;
  const_iterator __begin3;
  AnimationCurveMap *__range3;
  AnimationCurveMap *curves;
  AnimationCurveNode *node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *__range2;
  int64_t adj_stop;
  int64_t adj_start;
  int64_t stop_local;
  int64_t start_local;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *nodes_local;
  FBXConverter *this_local;
  KeyFrameListList *inputs;
  
  std::
  vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
  ::vector(__return_storage_ptr__);
  sVar2 = std::
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          ::size(nodes);
  std::
  vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
  ::reserve(__return_storage_ptr__,sVar2 * 3);
  __end2 = std::
           vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
           ::begin(nodes);
  node = (AnimationCurveNode *)
         std::
         vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
         ::end(nodes);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::FBX::AnimationCurveNode_*const_*,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>
                                *)&node);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    ppAVar3 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::AnimationCurveNode_*const_*,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>
              ::operator*(&__end2);
    if (*ppAVar3 == (AnimationCurveNode *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                    ,0xc92,
                    "FBXConverter::KeyFrameListList Assimp::FBX::FBXConverter::GetKeyframeList(const std::vector<const AnimationCurveNode *> &, int64_t, int64_t)"
                   );
    }
    this_01 = AnimationCurveNode::Curves_abi_cxx11_(*ppAVar3);
    __end3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
             ::begin(this_01);
    kv = (value_type *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
         ::end(this_01);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&kv), bVar1) {
      ppStack_a0 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>
                   ::operator*(&__end3);
      bVar1 = std::operator==(&ppStack_a0->first,"d|X");
      if (bVar1) {
        curve._4_4_ = 0;
LAB_0097d525:
        this_00 = ppStack_a0->second;
        pKVar4 = AnimationCurve::GetKeys(this_00);
        sVar2 = std::vector<long,_std::allocator<long>_>::size(pKVar4);
        pKVar5 = AnimationCurve::GetValues(this_00);
        sVar6 = std::vector<float,_std::allocator<float>_>::size(pKVar5);
        bVar1 = false;
        if (sVar2 == sVar6) {
          pKVar4 = AnimationCurve::GetKeys(this_00);
          sVar2 = std::vector<long,_std::allocator<long>_>::size(pKVar4);
          bVar1 = sVar2 != 0;
        }
        if (!bVar1) {
          __assert_fail("curve->GetKeys().size() == curve->GetValues().size() && curve->GetKeys().size()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                        ,0xca7,
                        "FBXConverter::KeyFrameListList Assimp::FBX::FBXConverter::GetKeyframeList(const std::vector<const AnimationCurveNode *> &, int64_t, int64_t)"
                       );
        }
        this_02 = (vector<long,_std::allocator<long>_> *)operator_new(0x18);
        (this_02->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (this_02->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        (this_02->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<long,_std::allocator<long>_>::vector(this_02);
        std::shared_ptr<std::vector<long,std::allocator<long>>>::
        shared_ptr<std::vector<long,std::allocator<long>>,void>
                  ((shared_ptr<std::vector<long,std::allocator<long>>> *)
                   &Values.
                    super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,this_02);
        this_03 = (vector<float,_std::allocator<float>_> *)operator_new(0x18);
        (this_03->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        (this_03->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        (this_03->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        std::vector<float,_std::allocator<float>_>::vector(this_03);
        std::shared_ptr<std::vector<float,std::allocator<float>>>::
        shared_ptr<std::vector<float,std::allocator<float>>,void>
                  ((shared_ptr<std::vector<float,std::allocator<float>>> *)&count,this_03);
        pKVar4 = AnimationCurve::GetKeys(this_00);
        n = std::vector<long,_std::allocator<long>_>::size(pKVar4);
        peVar7 = std::
                 __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&Values.
                                  super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        std::vector<long,_std::allocator<long>_>::reserve(peVar7,n);
        peVar8 = std::
                 __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&count);
        std::vector<float,_std::allocator<float>_>::reserve(peVar8,n);
        for (k = 0; (ulong)k < n; k = k + 1) {
          pKVar4 = AnimationCurve::GetKeys(this_00);
          pvVar9 = std::vector<long,_std::allocator<long>_>::at(pKVar4,k);
          local_e8 = *pvVar9;
          if ((start + -10000 <= local_e8) && (local_e8 <= stop + 10000)) {
            peVar7 = std::
                     __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&Values.
                                      super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
            std::vector<long,_std::allocator<long>_>::push_back(peVar7,&local_e8);
            peVar8 = std::
                     __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&count);
            pKVar5 = AnimationCurve::GetValues(this_00);
            __x = std::vector<float,_std::allocator<float>_>::at(pKVar5,k);
            std::vector<float,_std::allocator<float>_>::push_back(peVar8,__x);
          }
        }
        std::
        make_tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>&,std::shared_ptr<std::vector<float,std::allocator<float>>>&,unsigned_int&>
                  (&local_110,
                   (shared_ptr<std::vector<long,_std::allocator<long>_>_> *)
                   &Values.
                    super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(shared_ptr<std::vector<float,_std::allocator<float>_>_> *)&count,
                   (uint *)((long)&curve + 4));
        std::
        vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ::push_back(__return_storage_ptr__,&local_110);
        std::
        tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
        ::~tuple(&local_110);
        std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::~shared_ptr
                  ((shared_ptr<std::vector<float,_std::allocator<float>_>_> *)&count);
        std::shared_ptr<std::vector<long,_std::allocator<long>_>_>::~shared_ptr
                  ((shared_ptr<std::vector<long,_std::allocator<long>_>_> *)
                   &Values.
                    super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      else {
        bVar1 = std::operator==(&ppStack_a0->first,"d|Y");
        if (bVar1) {
          curve._4_4_ = 1;
          goto LAB_0097d525;
        }
        bVar1 = std::operator==(&ppStack_a0->first,"d|Z");
        if (bVar1) {
          curve._4_4_ = 2;
          goto LAB_0097d525;
        }
        LogFunctions<Assimp::FBXImporter>::LogWarn
                  ("ignoring scale animation curve, did not recognize target component");
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::AnimationCurveNode_*const_*,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

FBXConverter::KeyFrameListList FBXConverter::GetKeyframeList(const std::vector<const AnimationCurveNode*>& nodes, int64_t start, int64_t stop)
        {
            KeyFrameListList inputs;
            inputs.reserve(nodes.size() * 3);

            //give some breathing room for rounding errors
            int64_t adj_start = start - 10000;
            int64_t adj_stop = stop + 10000;

            for (const AnimationCurveNode* node : nodes) {
                ai_assert(node);

                const AnimationCurveMap& curves = node->Curves();
                for (const AnimationCurveMap::value_type& kv : curves) {

                    unsigned int mapto;
                    if (kv.first == "d|X") {
                        mapto = 0;
                    }
                    else if (kv.first == "d|Y") {
                        mapto = 1;
                    }
                    else if (kv.first == "d|Z") {
                        mapto = 2;
                    }
                    else {
                        FBXImporter::LogWarn("ignoring scale animation curve, did not recognize target component");
                        continue;
                    }

                    const AnimationCurve* const curve = kv.second;
                    ai_assert(curve->GetKeys().size() == curve->GetValues().size() && curve->GetKeys().size());

                    //get values within the start/stop time window
                    std::shared_ptr<KeyTimeList> Keys(new KeyTimeList());
                    std::shared_ptr<KeyValueList> Values(new KeyValueList());
                    const size_t count = curve->GetKeys().size();
                    Keys->reserve(count);
                    Values->reserve(count);
                    for (size_t n = 0; n < count; n++)
                    {
                        int64_t k = curve->GetKeys().at(n);
                        if (k >= adj_start && k <= adj_stop)
                        {
                            Keys->push_back(k);
                            Values->push_back(curve->GetValues().at(n));
                        }
                    }

                    inputs.push_back(std::make_tuple(Keys, Values, mapto));
                }
            }
            return inputs; // pray for NRVO :-)
        }